

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void R_InitShadeMaps(void)

{
  BYTE *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int k;
  long lVar9;
  byte bVar10;
  
  pBVar1 = shadetables;
  iVar2 = 0x20;
  iVar3 = 0x10;
  lVar6 = 0;
  do {
    ShadeFakeColormap[lVar6].Color.field_0.d = 0xffffffff;
    ShadeFakeColormap[lVar6].Desaturate = -1;
    ShadeFakeColormap[lVar6].Next = (FDynamicColormap *)0x0;
    ShadeFakeColormap[lVar6].Maps = pBVar1;
    uVar7 = 0x2000;
    iVar8 = 0;
    do {
      iVar4 = (int)(uVar7 >> 5);
      uVar5 = iVar2 * iVar4 + 0x100;
      lVar9 = 0;
      do {
        bVar10 = (byte)(uVar5 >> 0xe);
        if (0x3f < bVar10) {
          bVar10 = 0x40;
        }
        pBVar1[lVar9] = bVar10;
        lVar9 = lVar9 + 1;
        uVar5 = uVar5 + iVar4 * iVar3;
      } while (lVar9 != 0x100);
      pBVar1 = pBVar1 + 0x100;
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 - 0x100;
    } while (iVar8 != 0x20);
    lVar6 = lVar6 + 1;
    iVar2 = iVar2 + -2;
    iVar3 = iVar3 + -1;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    if (0x40 < shadetables[lVar6]) {
      __assert_fail("shadetables[i] <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                    ,0x9c,"void R_InitShadeMaps()");
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20000);
  lVar6 = 0;
  do {
    identitymap[lVar6] = (BYTE)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

void R_InitShadeMaps()
{
	int i,j;
	// set up shading tables for shaded columns
	// 16 colormap sets, progressing from full alpha to minimum visible alpha

	BYTE *table = shadetables;

	// Full alpha
	for (i = 0; i < 16; ++i)
	{
		ShadeFakeColormap[i].Color = ~0u;
		ShadeFakeColormap[i].Desaturate = ~0u;
		ShadeFakeColormap[i].Next = NULL;
		ShadeFakeColormap[i].Maps = table;

		for (j = 0; j < NUMCOLORMAPS; ++j)
		{
			int a = (NUMCOLORMAPS - j) * 256 / NUMCOLORMAPS * (16-i);
			for (int k = 0; k < 256; ++k)
			{
				BYTE v = (((k+2) * a) + 256) >> 14;
				table[k] = MIN<BYTE> (v, 64);
			}
			table += 256;
		}
	}
	for (i = 0; i < NUMCOLORMAPS*16*256; ++i)
	{
		assert(shadetables[i] <= 64);
	}

	// Set up a guaranteed identity map
	for (i = 0; i < 256; ++i)
	{
		identitymap[i] = i;
	}
}